

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_proxy(Curl_easy *data,connectdata *conn,char *proxy,curl_proxytype proxytype)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  ulong uVar5;
  size_t sVar6;
  proxy_info *ppVar7;
  byte bVar8;
  proxy_info *ppVar9;
  byte *__s;
  byte *pbVar10;
  CURLcode CVar11;
  byte *__s_00;
  bool bVar12;
  char *proxypasswd;
  char *proxyuser;
  char *endp;
  char *local_68;
  char *local_60;
  connectdata *local_58;
  CURLcode local_4c;
  proxy_info *local_48;
  byte *local_40;
  char *local_38;
  
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_58 = conn;
  pcVar3 = strstr(proxy,"://");
  __s = (byte *)proxy;
  if (pcVar3 != (char *)0x0) {
    __s = (byte *)(pcVar3 + 3);
    iVar2 = curl_strnequal("https",proxy,5);
    if (iVar2 == 0) {
      iVar2 = curl_strnequal("socks5h",proxy,7);
      if (iVar2 == 0) {
        iVar2 = curl_strnequal("socks5",proxy,6);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal("socks4a",proxy,7);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal("socks4",proxy,6);
            if ((iVar2 == 0) && (iVar2 = curl_strnequal("socks",proxy,5), iVar2 == 0)) {
              iVar2 = curl_strnequal("http:",proxy,5);
              if (iVar2 == 0) {
                Curl_failf(data,"Unsupported proxy scheme for \'%s\'",proxy);
                return CURLE_COULDNT_CONNECT;
              }
            }
            else {
              proxytype = CURLPROXY_SOCKS4;
            }
          }
          else {
            proxytype = CURLPROXY_SOCKS4A;
          }
        }
        else {
          proxytype = CURLPROXY_SOCKS5;
        }
      }
      else {
        proxytype = CURLPROXY_SOCKS5_HOSTNAME;
      }
    }
    else {
      proxytype = CURLPROXY_HTTPS;
    }
  }
  pcVar3 = strchr((char *)__s,0x40);
  if (pcVar3 != (char *)0x0) {
    local_4c = parse_login_details((char *)__s,(long)pcVar3 - (long)__s,&local_60,&local_68,
                                   (char **)0x0);
    __s = (byte *)(pcVar3 + 1);
    if (local_4c != CURLE_OK) {
      return local_4c;
    }
  }
  __s_00 = __s;
  if (*__s == 0x5b) {
    __s_00 = __s + 1;
    bVar8 = __s[1];
    pbVar10 = __s_00;
    if (bVar8 != 0) {
      ppuVar4 = __ctype_b_loc();
      pbVar10 = __s + 2;
      do {
        if (((((*ppuVar4)[bVar8] >> 0xc & 1) == 0) && (bVar8 != 0x2e)) && (bVar8 != 0x3a)) {
          if (bVar8 == 0x25) {
            iVar2 = strncmp("%25",(char *)(pbVar10 + -1),3);
            if (iVar2 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            }
            bVar8 = *pbVar10;
            if (bVar8 == 0) goto LAB_00572725;
            ppuVar4 = __ctype_b_loc();
            goto LAB_005726f4;
          }
          break;
        }
        bVar8 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar8 != 0);
      pbVar10 = pbVar10 + -1;
    }
    goto LAB_00572725;
  }
  goto LAB_00572747;
  while( true ) {
    bVar8 = pbVar10[1];
    pbVar10 = pbVar10 + 1;
    if (bVar8 == 0) break;
LAB_005726f4:
    if (((((*ppuVar4)[bVar8] & 0x1400) == 0) && (1 < bVar8 - 0x2d)) &&
       ((bVar8 != 0x5f && (bVar8 != 0x7e)))) break;
  }
LAB_00572725:
  if (*pbVar10 == 0x5d) {
    *pbVar10 = 0;
    __s = pbVar10 + 1;
  }
  else {
    Curl_infof(data,"Invalid IPv6 address format\n");
    __s = pbVar10;
  }
LAB_00572747:
  pcVar3 = strchr((char *)__s,0x3a);
  if (pcVar3 == (char *)0x0) {
    if (*__s_00 == 0x2f) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar3 = strchr((char *)__s_00,0x2f);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    uVar5 = (data->set).proxyport;
    if ((uVar5 == 0) && (uVar5 = 0x438, proxytype == CURLPROXY_HTTPS)) {
      uVar5 = 0x1bb;
    }
  }
  else {
    local_38 = (char *)0x0;
    *pcVar3 = '\0';
    uVar5 = strtol(pcVar3 + 1,&local_38,10);
    if (((((local_38 == (char *)0x0) || (cVar1 = *local_38, cVar1 == '\0')) || (cVar1 == '/')) ||
        (cVar1 == ' ')) && (uVar5 < 0x10000)) {
      local_58->port = uVar5;
    }
    else {
      Curl_infof(data,"No valid port number in proxy string (%s)\n",pcVar3 + 1);
    }
  }
  if (*__s_00 == 0) goto LAB_005729a0;
  ppVar7 = &local_58->socks_proxy;
  ppVar9 = &local_58->http_proxy;
  if ((proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4) {
    ppVar9 = ppVar7;
  }
  ppVar9->proxytype = proxytype;
  local_40 = __s_00;
  if (local_60 == (char *)0x0) {
LAB_0057291b:
    if ((-1 < (long)uVar5) &&
       (((ppVar9->port = uVar5,
         (proxytype & ~(CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0)) == CURLPROXY_SOCKS4 ||
         (local_58->port < 0)) || ((ppVar7->host).rawalloc == (char *)0x0)))) {
      local_58->port = uVar5;
    }
    (*Curl_cfree)((ppVar9->host).rawalloc);
    (ppVar9->host).rawalloc = (char *)0x0;
    pcVar3 = (*Curl_cstrdup)((char *)local_40);
    (ppVar9->host).rawalloc = pcVar3;
    (ppVar9->host).name = pcVar3;
    bVar12 = pcVar3 != (char *)0x0;
    CVar11 = CURLE_OUT_OF_MEMORY;
    if (bVar12) {
      CVar11 = local_4c;
    }
  }
  else {
    local_48 = ppVar7;
    (*Curl_cfree)(ppVar9->user);
    ppVar9->user = (char *)0x0;
    pcVar3 = curl_easy_unescape(data,local_60,0,(int *)0x0);
    ppVar9->user = pcVar3;
    (*Curl_cfree)(local_60);
    local_60 = (char *)0x0;
    if (ppVar9->user == (char *)0x0) {
      (*Curl_cfree)(local_68);
    }
    else {
      (*Curl_cfree)(ppVar9->passwd);
      pcVar3 = local_68;
      ppVar9->passwd = (char *)0x0;
      if ((local_68 == (char *)0x0) || (sVar6 = strlen(local_68), 0xff < sVar6)) {
        pcVar3 = (*Curl_cstrdup)("");
      }
      else {
        pcVar3 = curl_easy_unescape(data,pcVar3,0,(int *)0x0);
      }
      ppVar9->passwd = pcVar3;
      (*Curl_cfree)(local_68);
      local_68 = (char *)0x0;
      if (ppVar9->passwd != (char *)0x0) {
        (local_58->bits).proxy_user_passwd = true;
        ppVar7 = local_48;
        goto LAB_0057291b;
      }
    }
    local_68 = (char *)0x0;
    bVar12 = false;
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
  if (!bVar12) {
    return CVar11;
  }
LAB_005729a0:
  (*Curl_cfree)(local_60);
  local_60 = (char *)0x0;
  (*Curl_cfree)(local_68);
  return CURLE_OK;
}

Assistant:

static CURLcode parse_proxy(struct Curl_easy *data,
                            struct connectdata *conn, char *proxy,
                            curl_proxytype proxytype)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;
  long port = -1;
  char *proxyuser = NULL;
  char *proxypasswd = NULL;
  bool sockstype;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("https", proxy))
      proxytype = CURLPROXY_HTTPS;
    else if(checkprefix("socks5h", proxy))
      proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      proxytype = CURLPROXY_SOCKS4;
    else if(checkprefix("http:", proxy))
      ; /* leave it as HTTP or HTTP/1.0 */
    else {
      /* Any other xxx:// reject! */
      failf(data, "Unsupported proxy scheme for \'%s\'", proxy);
      return CURLE_COULDNT_CONNECT;
    }
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

#ifndef HTTPS_PROXY_SUPPORT
  if(proxytype == CURLPROXY_HTTPS) {
    failf(data, "Unsupported proxy \'%s\'"
                ", libcurl is built without the HTTPS-proxy support.", proxy);
    return CURLE_NOT_BUILT_IN;
  }
#endif

  sockstype = proxytype == CURLPROXY_SOCKS5_HOSTNAME ||
              proxytype == CURLPROXY_SOCKS5 ||
              proxytype == CURLPROXY_SOCKS4A ||
              proxytype == CURLPROXY_SOCKS4;

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    CURLcode result =
      parse_login_details(proxyptr, atsign - proxyptr,
                              &proxyuser, &proxypasswd, NULL);
    if(result)
      return result;
    proxyptr = atsign + 1;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unreserved characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    char *endp = NULL;

    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    port = strtol(prox_portno, &endp, 10);
    if((endp && *endp && (*endp != '/') && (*endp != ' ')) ||
       (port < 0) || (port > 65535)) {
      /* meant to detect for example invalid IPv6 numerical addresses without
         brackets: "2a00:fac0:a000::7:13". Accept a trailing slash only
         because we then allow "URL style" with the number followed by a
         slash, used in curl test cases already. Space is also an acceptable
         terminating symbol. */
      infof(data, "No valid port number in proxy string (%s)\n",
            prox_portno);
    }
    else
      conn->port = port;
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = '\0'; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      port = data->set.proxyport;
    else {
      if(proxytype == CURLPROXY_HTTPS)
        port = CURL_DEFAULT_HTTPS_PROXY_PORT;
      else
        port = CURL_DEFAULT_PROXY_PORT;
    }
  }

  if(*proxyptr) {
    struct proxy_info *proxyinfo =
      sockstype ? &conn->socks_proxy : &conn->http_proxy;
    proxyinfo->proxytype = proxytype;

    if(proxyuser) {
      /* found user and password, rip them out.  note that we are unescaping
         them, as there is otherwise no way to have a username or password
         with reserved characters like ':' in them. */
      Curl_safefree(proxyinfo->user);
      proxyinfo->user = curl_easy_unescape(data, proxyuser, 0, NULL);
      Curl_safefree(proxyuser);

      if(!proxyinfo->user) {
        Curl_safefree(proxypasswd);
        return CURLE_OUT_OF_MEMORY;
      }

      Curl_safefree(proxyinfo->passwd);
      if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
        proxyinfo->passwd = curl_easy_unescape(data, proxypasswd, 0, NULL);
      else
        proxyinfo->passwd = strdup("");
      Curl_safefree(proxypasswd);

      if(!proxyinfo->passwd)
        return CURLE_OUT_OF_MEMORY;

      conn->bits.proxy_user_passwd = TRUE; /* enable it */
    }

    if(port >= 0) {
      proxyinfo->port = port;
      if(conn->port < 0 || sockstype || !conn->socks_proxy.host.rawalloc)
        conn->port = port;
    }

    /* now, clone the cleaned proxy host name */
    Curl_safefree(proxyinfo->host.rawalloc);
    proxyinfo->host.rawalloc = strdup(proxyptr);
    proxyinfo->host.name = proxyinfo->host.rawalloc;

    if(!proxyinfo->host.rawalloc)
      return CURLE_OUT_OF_MEMORY;
  }

  Curl_safefree(proxyuser);
  Curl_safefree(proxypasswd);

  return CURLE_OK;
}